

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

void __thiscall FastRandomContext::FastRandomContext(FastRandomContext *this,uint256 *seed)

{
  long lVar1;
  Span<const_std::byte> key;
  size_t in_RSI;
  ChaCha20 *in_RDI;
  long in_FS_OFFSET;
  Span<const_std::byte> SVar2;
  uint256 *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  RandomMixin<FastRandomContext>::RandomMixin((RandomMixin<FastRandomContext> *)in_RDI);
  *(undefined1 *)((long)(in_RDI->m_aligned).input + 0xc) = 0;
  SVar2 = MakeByteSpan<uint256_const&>(in_stack_ffffffffffffffd8);
  key.m_size = in_RSI;
  key.m_data = (byte *)SVar2.m_size;
  ChaCha20::ChaCha20(in_RDI,key);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

FastRandomContext::FastRandomContext(const uint256& seed) noexcept : requires_seed(false), rng(MakeByteSpan(seed)) {}